

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Specific.hh
# Opt level: O2

void avro::codec_traits<std::vector<double,_std::allocator<double>_>_>::encode
               (Encoder *e,vector<double,_std::allocator<double>_> *b)

{
  pointer pdVar1;
  pointer pdVar2;
  
  (**(code **)(*(long *)e + 0x70))();
  pdVar2 = (b->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  pdVar1 = (b->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  if (pdVar2 != pdVar1) {
    (**(code **)(*(long *)e + 0x90))(e,(long)pdVar1 - (long)pdVar2 >> 3);
    for (pdVar2 = (b->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        pdVar2 != (b->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_finish; pdVar2 = pdVar2 + 1) {
      (**(code **)(*(long *)e + 0x98))(e);
      (**(code **)(*(long *)e + 0x48))(*pdVar2,e);
    }
  }
  (**(code **)(*(long *)e + 0x78))(e);
  return;
}

Assistant:

static void encode(Encoder& e, const std::vector<T>& b) {
        e.arrayStart();
        if (! b.empty()) {
            e.setItemCount(b.size());
            for (typename std::vector<T>::const_iterator it = b.begin();
                it != b.end(); ++it) {
                e.startItem();
                avro::encode(e, *it);
            }
        }
        e.arrayEnd();
    }